

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KBO.cpp
# Opt level: O2

void __thiscall
Kernel::KBO::KBO(KBO *this,KboWeightMap<Kernel::FuncSigTraits> *funcWeights,DArray<int> *funcPrec,
                DArray<int> *typeConPrec,DArray<int> *predPrec,DArray<int> *predLevels,
                bool reverseLCM,bool qkbo)

{
  State *pSVar1;
  
  PrecedenceOrdering::PrecedenceOrdering
            (&this->super_PrecedenceOrdering,funcPrec,typeConPrec,predPrec,predLevels,reverseLCM,
             qkbo);
  (this->super_PrecedenceOrdering).super_Ordering._vptr_Ordering = (_func_int **)&PTR__KBO_009fe210;
  KboWeightMap<Kernel::FuncSigTraits>::KboWeightMap(&this->_funcWeights,funcWeights);
  pSVar1 = (State *)::operator_new(0x40);
  (pSVar1->_varDiffs)._timestamp = 1;
  (pSVar1->_varDiffs)._size = 0;
  (pSVar1->_varDiffs)._deleted = 0;
  (pSVar1->_varDiffs)._capacityIndex = 0;
  (pSVar1->_varDiffs)._capacity = 0;
  *(undefined8 *)&(pSVar1->_varDiffs)._nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&(pSVar1->_varDiffs)._entries + 4) = 0;
  *(undefined4 *)((long)&(pSVar1->_varDiffs)._afterLast + 4) = 0;
  (this->_state)._M_t.
  super___uniq_ptr_impl<Kernel::KBO::State,_std::default_delete<Kernel::KBO::State>_>._M_t.
  super__Tuple_impl<0UL,_Kernel::KBO::State_*,_std::default_delete<Kernel::KBO::State>_>.
  super__Head_base<0UL,_Kernel::KBO::State_*,_false>._M_head_impl = pSVar1;
  checkAdmissibility<void(*)(Lib::UserErrorException)>(this,throwError);
  return;
}

Assistant:

KBO::KBO(
    // KBO params
    KboWeightMap<FuncSigTraits> funcWeights, 
#if __KBO__CUSTOM_PREDICATE_WEIGHTS__
    KboWeightMap<PredSigTraits> predWeights, 
#endif

    // precedence ordering params
    DArray<int> funcPrec,
    DArray<int> typeConPrec,     
    DArray<int> predPrec, 
    DArray<int> predLevels, 

    // other
    bool reverseLCM,
    bool qkbo
  ) : PrecedenceOrdering(funcPrec, typeConPrec, predPrec, predLevels, reverseLCM, qkbo)
  , _funcWeights(funcWeights)
#if __KBO__CUSTOM_PREDICATE_WEIGHTS__
  , _predWeights(predWeights)
#endif
  , _state(new State())
{ 
  checkAdmissibility(throwError);
}